

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

ssize_t libssh2_sftp_read(LIBSSH2_SFTP_HANDLE *hnd,char *buffer,size_t buffer_maxlen)

{
  size_t *psVar1;
  long *plVar2;
  _libssh2_sftp_handle_data *p_Var3;
  libssh2_nonblocking_states lVar4;
  LIBSSH2_SESSION *pLVar5;
  bool bVar6;
  LIBSSH2_SFTP_HANDLE *pLVar7;
  LIBSSH2_CHANNEL *pLVar8;
  uint32_t uVar9;
  uint uVar10;
  int iVar11;
  LIBSSH2_SFTP_HANDLE *pLVar12;
  list_node *plVar13;
  list_node *plVar14;
  LIBSSH2_SFTP *sftp;
  uchar *puVar15;
  char *errmsg;
  list_node *plVar16;
  size_t sVar17;
  ulong __n;
  long lVar18;
  LIBSSH2_CHANNEL *channel;
  LIBSSH2_SFTP_HANDLE *unaff_R13;
  ssize_t sVar19;
  LIBSSH2_SFTP_HANDLE *pLVar20;
  LIBSSH2_SFTP_HANDLE *pLVar21;
  uchar *s;
  size_t in_stack_ffffffffffffff58;
  list_head *local_98;
  LIBSSH2_SFTP_HANDLE *local_90;
  LIBSSH2_SFTP_HANDLE *local_88;
  LIBSSH2_SFTP_HANDLE *local_80;
  list_head *local_78;
  LIBSSH2_SFTP *local_70;
  uchar *local_68;
  uint32_t local_5c;
  LIBSSH2_SFTP_HANDLE *local_58;
  LIBSSH2_SFTP_HANDLE *local_50;
  LIBSSH2_CHANNEL *local_48;
  char *local_40;
  time_t local_38;
  
  if (hnd == (LIBSSH2_SFTP_HANDLE *)0x0) {
    sVar19 = -0x27;
  }
  else {
    local_58 = (LIBSSH2_SFTP_HANDLE *)buffer;
    local_38 = time((time_t *)0x0);
    local_50 = (LIBSSH2_SFTP_HANDLE *)0x800000;
    if ((LIBSSH2_SFTP_HANDLE *)(buffer_maxlen * 4) < (LIBSSH2_SFTP_HANDLE *)0x800000) {
      local_50 = (LIBSSH2_SFTP_HANDLE *)(buffer_maxlen * 4);
    }
    local_5c = (int)local_50 * 8;
    local_40 = hnd->handle;
    local_78 = &hnd->packet_list;
    local_90 = hnd;
    local_80 = (LIBSSH2_SFTP_HANDLE *)buffer_maxlen;
    do {
      pLVar20 = local_50;
      sftp = hnd->sftp;
      channel = sftp->channel;
      pLVar5 = channel->session;
      lVar4 = sftp->read_state;
      if (lVar4 == libssh2_NB_state_sent2) {
LAB_00125478:
        sftp->read_state = libssh2_NB_state_idle;
        plVar13 = (list_node *)_libssh2_list_first(local_78);
        pLVar20 = local_58;
        pLVar12 = (LIBSSH2_SFTP_HANDLE *)buffer_maxlen;
        pLVar21 = (LIBSSH2_SFTP_HANDLE *)0x0;
        do {
          unaff_R13 = pLVar21;
          buffer_maxlen = (size_t)&sftp_read_read_responses;
          if (plVar13 == (list_node *)0x0) {
            if (unaff_R13 == (LIBSSH2_SFTP_HANDLE *)0x0) {
              iVar11 = _libssh2_error(pLVar5,-0x1f,"sftp_read() internal error");
              unaff_R13 = (LIBSSH2_SFTP_HANDLE *)(long)iVar11;
            }
            break;
          }
          local_68 = (uchar *)0x0;
          plVar14 = plVar13;
          pLVar21 = unaff_R13;
          if (plVar13[2].next == (list_node *)0x0) {
            iVar11 = sftp_packet_requirev
                               (sftp,0x1356dd,(uchar *)(ulong)*(uint *)&plVar13[2].prev,
                                (uint32_t)&local_98,&local_68,(size_t *)0x9,
                                in_stack_ffffffffffffff58);
            if ((iVar11 == -0x25) && (unaff_R13 != (LIBSSH2_SFTP_HANDLE *)0x0)) {
              bVar6 = false;
              pLVar12 = unaff_R13;
            }
            else {
              if (iVar11 == -0x26) {
                if (local_68 != (uchar *)0x0) {
                  (*pLVar5->free)(local_98,&pLVar5->abstract);
                }
                errmsg = "Response too small";
              }
              else {
                if (iVar11 < 0) {
                  sftp->read_state = libssh2_NB_state_sent2;
                  goto LAB_00125523;
                }
                if (*(uchar *)&local_98->last == 'g') {
                  if (plVar13[1].next == (list_node *)(local_90->u).file.offset) {
                    uVar10 = _libssh2_ntohu32((uchar *)((long)&local_98->last + 5));
                    pLVar7 = local_90;
                    plVar16 = (list_node *)(ulong)uVar10;
                    if ((list_node *)(local_68 + -9) < plVar16) {
                      errmsg = "SFTP Protocol badness";
                    }
                    else {
                      lVar18 = (long)plVar16 - (long)plVar13[1].prev;
                      if (plVar16 < plVar13[1].prev || lVar18 == 0) {
                        if (lVar18 != 0) {
                          plVar2 = (long *)((long)&local_90->u + 8);
                          *plVar2 = *plVar2 + lVar18;
                        }
                        sVar17 = (long)(unaff_R13->handle + (long)&plVar16[-2].head) -
                                 (long)local_80;
                        if ((LIBSSH2_SFTP_HANDLE *)(unaff_R13->handle + (long)&plVar16[-2].head) <
                            local_80 || sVar17 == 0) {
                          puVar15 = (uchar *)0x0;
                        }
                        else {
                          (local_90->u).file.data_left = sVar17;
                          uVar10 = (int)local_80 - (int)unaff_R13;
                          (local_90->u).file.data = (uchar *)local_98;
                          puVar15 = local_68;
                        }
                        *(uchar **)((long)&local_90->u + 0x20) = puVar15;
                        __n = (ulong)uVar10;
                        local_88 = pLVar20;
                        memcpy(pLVar20,(void *)((long)&local_98->first + 1),__n);
                        p_Var3 = &pLVar7->u;
                        (p_Var3->file).offset = (p_Var3->file).offset + __n;
                        if (*(long *)((long)&pLVar7->u + 0x20) == 0) {
                          (*pLVar5->free)(local_98,&pLVar5->abstract);
                        }
                        pLVar21 = (LIBSSH2_SFTP_HANDLE *)(unaff_R13->handle + (__n - 0x20));
                        pLVar20 = (LIBSSH2_SFTP_HANDLE *)(local_88->handle + (__n - 0x20));
                        plVar14 = (list_node *)_libssh2_list_next(plVar13);
                        _libssh2_list_remove(plVar13);
                        (*pLVar5->free)(plVar13,&pLVar5->abstract);
                        if (local_80 <= pLVar21) {
                          plVar14 = (list_node *)0x0;
                        }
                        bVar6 = true;
                        goto LAB_00125561;
                      }
                      errmsg = "FXP_READ response too big";
                    }
                  }
                  else {
                    errmsg = "Read Packet At Unexpected Offset";
                  }
                }
                else {
                  if (*(uchar *)&local_98->last == 'e') {
                    _libssh2_list_remove(plVar13);
                    (*pLVar5->free)(plVar13,&pLVar5->abstract);
                    sftp_packetlist_flush(local_90);
                    uVar9 = _libssh2_ntohu32((uchar *)((long)&local_98->last + 5));
                    (*pLVar5->free)(local_98,&pLVar5->abstract);
                    if (uVar9 == 1) {
                      (local_90->u).file.eof = '\x01';
                      bVar6 = false;
                      pLVar12 = unaff_R13;
                    }
                    else {
                      sftp->last_errno = uVar9;
                      iVar11 = _libssh2_error(pLVar5,-0x1f,"SFTP READ error");
                      bVar6 = false;
                      pLVar12 = (LIBSSH2_SFTP_HANDLE *)(long)iVar11;
                    }
                    goto LAB_00125561;
                  }
                  errmsg = "SFTP Protocol badness: unrecognised read request response";
                }
              }
              iVar11 = _libssh2_error(pLVar5,-0x1f,errmsg);
              bVar6 = false;
              pLVar12 = (LIBSSH2_SFTP_HANDLE *)(long)iVar11;
            }
          }
          else if (unaff_R13 == (LIBSSH2_SFTP_HANDLE *)0x0) {
            iVar11 = _libssh2_error(pLVar5,-0x1f,"sftp_read() internal error");
            unaff_R13 = (LIBSSH2_SFTP_HANDLE *)0x0;
LAB_00125523:
            bVar6 = false;
            pLVar12 = (LIBSSH2_SFTP_HANDLE *)(long)iVar11;
            pLVar21 = unaff_R13;
          }
          else {
            bVar6 = false;
            pLVar12 = unaff_R13;
          }
LAB_00125561:
          unaff_R13 = pLVar12;
          buffer_maxlen = (size_t)&sftp_read_read_responses;
          plVar13 = plVar14;
          pLVar12 = unaff_R13;
        } while (bVar6);
      }
      else {
        pLVar12 = (LIBSSH2_SFTP_HANDLE *)buffer_maxlen;
        if (lVar4 == libssh2_NB_state_sent) {
LAB_00125401:
          buffer_maxlen = (size_t)pLVar12;
          sftp->read_state = libssh2_NB_state_idle;
          for (plVar13 = (list_node *)_libssh2_list_first(local_78); plVar13 != (list_node *)0x0;
              plVar13 = (list_node *)_libssh2_list_next(plVar13)) {
            while (plVar13[2].next != (list_node *)0x0) {
              unaff_R13 = (LIBSSH2_SFTP_HANDLE *)
                          _libssh2_channel_write
                                    (channel,0,
                                     (undefined1 *)((long)&plVar13[2].prev + 4) +
                                     (long)&(plVar13[1].head)->last,(size_t)plVar13[2].next);
              if ((long)unaff_R13 < 0) {
                sftp->read_state = libssh2_NB_state_sent;
                goto LAB_001257a1;
              }
              plVar13[1].head = (list_head *)(unaff_R13->handle + (long)(plVar13[1].head + -2));
              plVar14 = plVar13 + 2;
              plVar14->next = (list_node *)((long)plVar14->next - (long)unaff_R13);
              if (plVar14->next == (list_node *)0x0) break;
              plVar14 = (list_node *)_libssh2_list_first(local_78);
              if (plVar13 != plVar14) goto LAB_00125478;
            }
          }
          goto LAB_00125478;
        }
        if (lVar4 != libssh2_NB_state_idle) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/libssh2[P]libssh2/src/sftp.c"
                        ,0x6fa,"ssize_t sftp_read(LIBSSH2_SFTP_HANDLE *, char *, size_t)");
        }
        sftp->last_errno = 0;
        pLVar12 = (LIBSSH2_SFTP_HANDLE *)(hnd->u).file.data_left;
        if (pLVar12 == (LIBSSH2_SFTP_HANDLE *)0x0) {
          if ((hnd->u).file.eof == '\0') {
            pLVar12 = (LIBSSH2_SFTP_HANDLE *)(*(long *)((long)&hnd->u + 8) - (hnd->u).file.offset);
            local_88 = (LIBSSH2_SFTP_HANDLE *)((long)local_50 - (long)pLVar12);
            if (local_50 < pLVar12) {
              local_88 = (LIBSSH2_SFTP_HANDLE *)0x0;
            }
            local_70 = sftp;
            pLVar12 = (LIBSSH2_SFTP_HANDLE *)
                      libssh2_channel_window_read_ex
                                (channel,(unsigned_long *)0x0,(unsigned_long *)0x0);
            buffer_maxlen = (size_t)pLVar20;
            if (pLVar12 < pLVar20) {
              buffer_maxlen = 0;
              iVar11 = _libssh2_channel_receive_window_adjust
                                 (local_70->channel,local_5c,'\x01',(uint *)0x0);
              if (iVar11 == 0) goto LAB_001252af;
              unaff_R13 = (LIBSSH2_SFTP_HANDLE *)(long)iVar11;
              if (iVar11 == -0x25) {
                if ((hnd->u).file.data_left != 0) {
                  __assert_fail("rc != LIBSSH2_ERROR_EAGAIN || !filep->data_left",
                                "/workspace/llm4binary/github/license_c_cmakelists/libssh2[P]libssh2/src/sftp.c"
                                ,0x5f4,"ssize_t sftp_read(LIBSSH2_SFTP_HANDLE *, char *, size_t)");
                }
                if ((hnd->u).file.eof != '\0') {
                  __assert_fail("rc != LIBSSH2_ERROR_EAGAIN || !filep->eof",
                                "/workspace/llm4binary/github/license_c_cmakelists/libssh2[P]libssh2/src/sftp.c"
                                ,0x5f5,"ssize_t sftp_read(LIBSSH2_SFTP_HANDLE *, char *, size_t)");
                }
                buffer_maxlen = 0;
              }
            }
            else {
LAB_001252af:
              buffer_maxlen = CONCAT71((int7)(buffer_maxlen >> 8),1);
            }
            pLVar8 = channel;
            if ((char)buffer_maxlen != '\0') {
              do {
                local_48 = pLVar8;
                buffer_maxlen = (size_t)local_90;
                sftp = local_70;
                pLVar12 = unaff_R13;
                if (local_88 == (LIBSSH2_SFTP_HANDLE *)0x0) goto LAB_00125401;
                pLVar20 = (LIBSSH2_SFTP_HANDLE *)local_90->handle_len;
                iVar11 = (int)pLVar20;
                plVar14 = (list_node *)(ulong)(iVar11 + 0x19);
                plVar13 = (list_node *)(*pLVar5->alloc)((size_t)&plVar14[2].head,&pLVar5->abstract);
                pLVar12 = local_88;
                if (plVar13 == (list_node *)0x0) {
                  iVar11 = _libssh2_error(pLVar5,-6,"malloc fail for FXP_WRITE");
                  unaff_R13 = (LIBSSH2_SFTP_HANDLE *)(long)iVar11;
                  buffer_maxlen = (size_t)pLVar20;
                }
                else {
                  pLVar20 = local_80;
                  if (local_80 <= (LIBSSH2_SFTP_HANDLE *)((ulong)local_88 & 0xffffffff)) {
                    pLVar20 = local_88;
                  }
                  uVar10 = (uint)pLVar20;
                  if (29999 < (uint)pLVar20) {
                    uVar10 = 30000;
                  }
                  pLVar20 = (LIBSSH2_SFTP_HANDLE *)(ulong)uVar10;
                  plVar13[1].next =
                       *(list_node **)((long)&((LIBSSH2_SFTP_HANDLE *)buffer_maxlen)->u + 8);
                  plVar13[1].prev = (list_node *)pLVar20;
                  plVar13[2].next = plVar14;
                  plVar13[1].head = (list_head *)0x0;
                  local_98 = (list_head *)((long)&plVar13[2].prev + 4);
                  _libssh2_store_u32((uchar **)&local_98,iVar11 + 0x15);
                  *(undefined1 *)&local_98->last = 5;
                  uVar9 = local_70->request_id;
                  local_70->request_id = uVar9 + 1;
                  *(uint32_t *)&plVar13[2].prev = uVar9;
                  local_98 = (list_head *)((long)&local_98->last + 1);
                  _libssh2_store_u32((uchar **)&local_98,uVar9);
                  _libssh2_store_str((uchar **)&local_98,local_40,
                                     ((LIBSSH2_SFTP_HANDLE *)buffer_maxlen)->handle_len);
                  _libssh2_store_u64((uchar **)&local_98,
                                     *(libssh2_uint64_t *)
                                      ((long)&((LIBSSH2_SFTP_HANDLE *)buffer_maxlen)->u + 8));
                  plVar2 = (long *)((long)&((LIBSSH2_SFTP_HANDLE *)buffer_maxlen)->u + 8);
                  *plVar2 = (long)(pLVar20->handle + *plVar2 + -0x20);
                  _libssh2_store_u32((uchar **)&local_98,uVar10);
                  _libssh2_list_add(local_78,plVar13);
                  local_88 = (LIBSSH2_SFTP_HANDLE *)((long)pLVar12 - (long)pLVar20);
                  channel = local_48;
                  if (pLVar12 < pLVar20) {
                    local_88 = (LIBSSH2_SFTP_HANDLE *)0x0;
                  }
                }
                pLVar8 = local_48;
              } while (plVar13 != (list_node *)0x0);
            }
          }
          else {
            unaff_R13 = (LIBSSH2_SFTP_HANDLE *)0x0;
          }
        }
        else {
          unaff_R13 = local_80;
          if (pLVar12 < local_80) {
            unaff_R13 = pLVar12;
          }
          memcpy(local_58,(hnd->u).file.data + (*(long *)((long)&hnd->u + 0x20) - (long)pLVar12),
                 (size_t)unaff_R13);
          (hnd->u).file.offset =
               (libssh2_uint64_t)(unaff_R13->handle + ((hnd->u).file.offset - 0x20));
          psVar1 = &(hnd->u).file.data_left;
          *psVar1 = *psVar1 - (long)unaff_R13;
          if (*psVar1 == 0) {
            (*pLVar5->free)((hnd->u).file.data,&pLVar5->abstract);
            (hnd->u).file.data = (uchar *)0x0;
          }
        }
      }
LAB_001257a1:
      hnd = local_90;
      if (unaff_R13 != (LIBSSH2_SFTP_HANDLE *)0xffffffffffffffdb) {
        return (ssize_t)unaff_R13;
      }
      pLVar5 = local_90->sftp->channel->session;
      unaff_R13 = (LIBSSH2_SFTP_HANDLE *)0xffffffffffffffdb;
      if (pLVar5 == (LIBSSH2_SESSION *)0x0) {
        return -0x25;
      }
      if (pLVar5->api_block_mode == 0) {
        return -0x25;
      }
      iVar11 = _libssh2_wait_socket(pLVar5,local_38);
    } while (iVar11 == 0);
    sVar19 = (ssize_t)iVar11;
  }
  return sVar19;
}

Assistant:

static ssize_t sftp_read(LIBSSH2_SFTP_HANDLE * handle, char *buffer,
                         size_t buffer_size)
{
    LIBSSH2_SFTP *sftp = handle->sftp;
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t count = 0;
    struct sftp_pipeline_chunk *chunk;
    struct sftp_pipeline_chunk *next;
    ssize_t rc;
    struct _libssh2_sftp_handle_file_data *filep =
        &handle->u.file;
    size_t bytes_in_buffer = 0;
    char *sliding_bufferp = buffer;

    /* This function can be interrupted in three different places where it
       might need to wait for data from the network.  It returns EAGAIN to
       allow non-blocking clients to do other work but these client are
       expected to call this function again (possibly many times) to finish
       the operation.

       The tricky part is that if we previously aborted a sftp_read due to
       EAGAIN, we must continue at the same spot to continue the previously
       interrupted operation.  This is done using a state machine to record
       what phase of execution we were at.  The state is stored in
       sftp->read_state.

       libssh2_NB_state_idle: The first phase is where we prepare multiple
       FXP_READ packets to do optimistic read-ahead.  We send off as many as
       possible in the second phase without waiting for a response to each
       one; this is the key to fast reads. But we may have to adjust the
       channel window size to do this which may interrupt this function while
       waiting.  The state machine saves the phase as libssh2_NB_state_idle so
       it returns here on the next call.

       libssh2_NB_state_sent: The second phase is where we send the FXP_READ
       packets.  Writing them to the channel can be interrupted with EAGAIN
       but the state machine ensures we skip the first phase on the next call
       and resume sending.

       libssh2_NB_state_sent2: In the third phase (indicated by ) we read the
       data from the responses that have arrived so far.  Reading can be
       interrupted with EAGAIN but the state machine ensures we skip the first
       and second phases on the next call and resume sending.
    */

    switch(sftp->read_state) {
    case libssh2_NB_state_idle:
        sftp->last_errno = LIBSSH2_FX_OK;

        /* Some data may already have been read from the server in the
           previous call but didn't fit in the buffer at the time.  If so, we
           return that now as we can't risk being interrupted later with data
           partially written to the buffer. */
        if(filep->data_left) {
            size_t copy = LIBSSH2_MIN(buffer_size, filep->data_left);

            memcpy(buffer, &filep->data[ filep->data_len - filep->data_left],
                   copy);

            filep->data_left -= copy;
            filep->offset += copy;

            if(!filep->data_left) {
                LIBSSH2_FREE(session, filep->data);
                filep->data = NULL;
            }

            return copy;
        }

        if(filep->eof) {
            return 0;
        }
        else {
            /* We allow a number of bytes being requested at any given time
               without having been acked - until we reach EOF. */

            /* Number of bytes asked for that haven't been acked yet */
            size_t already = (size_t)(filep->offset_sent - filep->offset);

            size_t max_read_ahead = buffer_size*4;
            unsigned long recv_window;

            if(max_read_ahead > LIBSSH2_CHANNEL_WINDOW_DEFAULT*4)
                max_read_ahead = LIBSSH2_CHANNEL_WINDOW_DEFAULT*4;

            /* if the buffer_size passed in now is smaller than what has
               already been sent, we risk getting count become a very large
               number */
            if(max_read_ahead > already)
                count = max_read_ahead - already;

            /* 'count' is how much more data to ask for, and 'already' is how
               much data that already has been asked for but not yet returned.
               Specifically, 'count' means how much data that have or will be
               asked for by the nodes that are already added to the linked
               list. Some of those read requests may not actually have been
               sent off successfully yet.

               If 'already' is very large it should be perfectly fine to have
               count set to 0 as then we don't have to ask for more data
               (right now).

               buffer_size*4 is just picked more or less out of the air. The
               idea is that when reading SFTP from a remote server, we send
               away multiple read requests guessing that the client will read
               more than only this 'buffer_size' amount of memory. So we ask
               for maximum buffer_size*4 amount of data so that we can return
               them very fast in subsequent calls.
            */

            recv_window = libssh2_channel_window_read_ex(sftp->channel,
                                                         NULL, NULL);
            if(max_read_ahead > recv_window) {
                /* more data will be asked for than what the window currently
                   allows, expand it! */

                rc = _libssh2_channel_receive_window_adjust(sftp->channel,
                                               (uint32_t)(max_read_ahead * 8),
                                               1, NULL);
                /* if this returns EAGAIN, we will get back to this function
                   at next call */
                assert(rc != LIBSSH2_ERROR_EAGAIN || !filep->data_left);
                assert(rc != LIBSSH2_ERROR_EAGAIN || !filep->eof);
                if(rc)
                    return rc;
            }
        }

        while(count > 0) {
            unsigned char *s;

            /* 25 = packet_len(4) + packet_type(1) + request_id(4) +
               handle_len(4) + offset(8) + count(4) */
            uint32_t packet_len = (uint32_t)(handle->handle_len + 25);
            uint32_t request_id;

            uint32_t size = (uint32_t)count;
            if(size < buffer_size)
                size = (uint32_t)buffer_size;
            if(size > MAX_SFTP_READ_SIZE)
                size = MAX_SFTP_READ_SIZE;

            chunk = LIBSSH2_ALLOC(session, packet_len +
                                  sizeof(struct sftp_pipeline_chunk));
            if(!chunk)
                return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                      "malloc fail for FXP_WRITE");

            chunk->offset = filep->offset_sent;
            chunk->len = size;
            chunk->lefttosend = packet_len;
            chunk->sent = 0;

            s = chunk->packet;

            _libssh2_store_u32(&s, packet_len - 4);
            *s++ = SSH_FXP_READ;
            request_id = sftp->request_id++;
            chunk->request_id = request_id;
            _libssh2_store_u32(&s, request_id);
            _libssh2_store_str(&s, handle->handle, handle->handle_len);
            _libssh2_store_u64(&s, filep->offset_sent);
            filep->offset_sent += size; /* advance offset at once */
            _libssh2_store_u32(&s, size);

            /* add this new entry LAST in the list */
            _libssh2_list_add(&handle->packet_list, &chunk->node);
            /* deduct the size we used, as we might have to create
               more packets */
            count -= LIBSSH2_MIN(size, count);
            _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                           "read request id %d sent (offset: %lu, size: %lu)",
                           request_id, (unsigned long)chunk->offset,
                           (unsigned long)chunk->len));
        }
        LIBSSH2_FALLTHROUGH();
    case libssh2_NB_state_sent:

        sftp->read_state = libssh2_NB_state_idle;

        /* move through the READ packets that haven't been sent and send as
           many as possible - remember that we don't block */
        chunk = _libssh2_list_first(&handle->packet_list);

        while(chunk) {
            if(chunk->lefttosend) {

                rc = _libssh2_channel_write(channel, 0,
                                            &chunk->packet[chunk->sent],
                                            chunk->lefttosend);
                if(rc < 0) {
                    sftp->read_state = libssh2_NB_state_sent;
                    return rc;
                }

                /* remember where to continue sending the next time */
                chunk->lefttosend -= rc;
                chunk->sent += rc;

                if(chunk->lefttosend) {
                    /* We still have data left to send for this chunk.
                     * If there is at least one completely sent chunk,
                     * we can get out of this loop and start reading.  */
                    if(chunk != _libssh2_list_first(&handle->packet_list)) {
                        break;
                    }
                    else {
                        continue;
                    }
                }
            }

            /* move on to the next chunk with data to send */
            chunk = _libssh2_list_next(&chunk->node);
        }
        LIBSSH2_FALLTHROUGH();

    case libssh2_NB_state_sent2:

        sftp->read_state = libssh2_NB_state_idle;

        /*
         * Count all ACKed packets and act on the contents of them.
         */
        chunk = _libssh2_list_first(&handle->packet_list);

        while(chunk) {
            unsigned char *data;
            size_t data_len = 0;
            uint32_t rc32;
            static const unsigned char read_responses[2] = {
                SSH_FXP_DATA, SSH_FXP_STATUS
            };

            if(chunk->lefttosend) {
                /* if the chunk still has data left to send, we shouldn't wait
                   for an ACK for it just yet */
                if(bytes_in_buffer > 0) {
                    return bytes_in_buffer;
                }
                else {
                    /* we should never reach this point */
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "sftp_read() internal error");
                }
            }

            rc = sftp_packet_requirev(sftp, 2, read_responses,
                                      chunk->request_id, &data, &data_len, 9);
            if(rc == LIBSSH2_ERROR_EAGAIN && bytes_in_buffer) {
                /* do not return EAGAIN if we have already
                 * written data into the buffer */
                return bytes_in_buffer;
            }

            if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
                if(data_len > 0) {
                    LIBSSH2_FREE(session, data);
                }
                return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                      "Response too small");
            }
            else if(rc < 0) {
                sftp->read_state = libssh2_NB_state_sent2;
                return rc;
            }

            /*
             * We get DATA or STATUS back. STATUS can be error, or it is
             * FX_EOF when we reach the end of the file.
             */

            switch(data[0]) {
            case SSH_FXP_STATUS:
                /* remove the chunk we just processed */

                _libssh2_list_remove(&chunk->node);
                LIBSSH2_FREE(session, chunk);

                /* we must remove all outstanding READ requests, as either we
                   got an error or we're at end of file */
                sftp_packetlist_flush(handle);

                rc32 = _libssh2_ntohu32(data + 5);
                LIBSSH2_FREE(session, data);

                if(rc32 == LIBSSH2_FX_EOF) {
                    filep->eof = TRUE;
                    return bytes_in_buffer;
                }
                else {
                    sftp->last_errno = rc32;
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "SFTP READ error");
                }

            case SSH_FXP_DATA:
                if(chunk->offset != filep->offset) {
                    /* This could happen if the server returns less bytes than
                       requested, which shouldn't happen for normal files. See:
                       https://tools.ietf.org/html/draft-ietf-secsh-filexfer-02
                       #section-6.4
                     */
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "Read Packet At Unexpected Offset");
                }

                rc32 = _libssh2_ntohu32(data + 5);
                if(rc32 > (data_len - 9))
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "SFTP Protocol badness");

                if(rc32 > chunk->len) {
                    /* A chunk larger than we requested was returned to us.
                       This is a protocol violation and we don't know how to
                       deal with it. Bail out! */
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "FXP_READ response too big");
                }

                if(rc32 != chunk->len) {
                    /* a short read does not imply end of file, but we must
                       adjust the offset_sent since it was advanced with a
                       full chunk->len before */
                    filep->offset_sent -= (chunk->len - rc32);
                }

                if((bytes_in_buffer + rc32) > buffer_size) {
                    /* figure out the overlap amount */
                    filep->data_left = (bytes_in_buffer + rc32) - buffer_size;

                    /* getting the full packet would overflow the buffer, so
                       only get the correct amount and keep the remainder */
                    rc32 = (uint32_t)(buffer_size - bytes_in_buffer);

                    /* store data to keep for next call */
                    filep->data = data;
                    filep->data_len = data_len;
                }
                else
                    filep->data_len = 0;

                /* copy the received data from the received FXP_DATA packet to
                   the buffer at the correct index */
                memcpy(sliding_bufferp, data + 9, rc32);
                filep->offset += rc32;
                bytes_in_buffer += rc32;
                sliding_bufferp += rc32;

                if(filep->data_len == 0)
                    /* free the allocated data if not stored to keep */
                    LIBSSH2_FREE(session, data);

                /* remove the chunk we just processed keeping track of the
                 * next one in case we need it */
                next = _libssh2_list_next(&chunk->node);
                _libssh2_list_remove(&chunk->node);
                LIBSSH2_FREE(session, chunk);

                /* check if we have space left in the buffer
                 * and either continue to the next chunk or stop
                 */
                if(bytes_in_buffer < buffer_size) {
                    chunk = next;
                }
                else {
                    chunk = NULL;
                }

                break;
            default:
                return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                      "SFTP Protocol badness: unrecognised "
                                      "read request response");
            }
        }

        if(bytes_in_buffer > 0)
            return bytes_in_buffer;

        break;

    default:
        assert(0);  /* State machine error; unrecognised read state */
    }

    /* we should never reach this point */
    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                          "sftp_read() internal error");
}